

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

enable_if_t<detail::move_always<bool>::value____detail::move_if_unreferenced<bool>::value,_bool>
pybind11::move<bool>(object *obj)

{
  make_caster<bool> mVar1;
  cast_error *this;
  handle local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((int)((obj->super_handle).m_ptr)->ob_refcnt < 2) {
    mVar1 = detail::load_type<bool>(&obj->super_handle);
    return (enable_if_t<detail::move_always<bool>::value____detail::move_if_unreferenced<bool>::value,_bool>
            )(mVar1.value & 1);
  }
  this = (cast_error *)__cxa_allocate_exception(0x10);
  local_e0.m_ptr = (PyObject *)PyObject_Str(((obj->super_handle).m_ptr)->ob_type);
  str::operator_cast_to_string(&local_b8,(str *)&local_e0);
  std::operator+(&local_98,"Unable to move from Python ",&local_b8);
  std::operator+(&local_78,&local_98," instance to C++ ");
  type_id<bool>();
  std::operator+(&local_58,&local_78,&local_d8);
  std::operator+(&local_38,&local_58," instance: instance has multiple references");
  cast_error::runtime_error(this,&local_38);
  __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

detail::enable_if_t<detail::move_always<T>::value || detail::move_if_unreferenced<T>::value, T> move(object &&obj) {
    if (obj.ref_count() > 1)
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ rvalue: instance has multiple references"
            " (compile in debug mode for details)");
#else
        throw cast_error("Unable to move from Python " + (std::string) obj.get_type().str() +
                " instance to C++ " + type_id<T>() + " instance: instance has multiple references");
#endif

    // Move into a temporary and return that, because the reference may be a local value of `conv`
    T ret = std::move(detail::load_type<T>(obj).operator T&());
    return ret;
}